

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptSet.cpp
# Opt level: O2

bool __thiscall Js::JavascriptSet::Has(JavascriptSet *this,Var value)

{
  bool bVar1;
  ThreadContext *pTVar2;
  code *pcVar3;
  BOOLEAN BVar4;
  bool bVar5;
  bool bVar6;
  BVIndex i;
  Var aValue;
  undefined4 *puVar7;
  Var local_30;
  Var simpleVar;
  Var value_local;
  
  pTVar2 = ((((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr
             )->super_JavascriptLibraryBase).scriptContext.ptr)->threadContext;
  bVar1 = pTVar2->noJsReentrancy;
  pTVar2->noJsReentrancy = true;
  simpleVar = value;
  switch(this->kind) {
  case EmptySet:
    break;
  case IntSet:
    aValue = JavascriptConversion::TryCanonicalizeAsTaggedInt<false,true>(value);
    if (aValue != (Var)0x0) {
      i = TaggedInt::ToInt32(aValue);
      BVar4 = BVSparse<Memory::Recycler>::Test((BVSparse<Memory::Recycler> *)this->u,i);
      bVar6 = BVar4 != '\0';
      goto LAB_00bb603c;
    }
    break;
  case SimpleVarSet:
    bVar5 = JsUtil::
            BaseDictionary<void_*,_Js::MapOrSetDataNode<void_*>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::ContainsKey((BaseDictionary<void_*,_Js::MapOrSetDataNode<void_*>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                           *)this->u,&simpleVar);
    bVar6 = true;
    if (!bVar5) {
      local_30 = JavascriptConversion::TryCanonicalizeAsSimpleVar<true>(simpleVar);
      bVar6 = false;
      if ((local_30 != (Var)0x0) && (local_30 != simpleVar)) {
        bVar6 = JsUtil::
                BaseDictionary<void_*,_Js::MapOrSetDataNode<void_*>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                ::ContainsKey((BaseDictionary<void_*,_Js::MapOrSetDataNode<void_*>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                               *)this->u,&local_30);
      }
    }
    goto LAB_00bb603c;
  case ComplexVarSet:
    bVar6 = JsUtil::
            BaseDictionary<void_*,_Js::MapOrSetDataNode<void_*>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::SameValueZeroComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::ContainsKey((BaseDictionary<void_*,_Js::MapOrSetDataNode<void_*>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::SameValueZeroComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                           *)this->u,&simpleVar);
    goto LAB_00bb603c;
  default:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptSet.cpp"
                                ,0x252,"((0))","(0)");
    if (!bVar6) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar7 = 0;
  }
  bVar6 = false;
LAB_00bb603c:
  pTVar2->noJsReentrancy = bVar1;
  return bVar6;
}

Assistant:

bool JavascriptSet::Has(Var value)
{
    JS_REENTRANCY_LOCK(jsReentLock, this->GetScriptContext()->GetThreadContext());
    switch (this->kind)
    {
    case SetKind::EmptySet:
        return false;

    case SetKind::IntSet:
    {
        Var taggedInt = JavascriptConversion::TryCanonicalizeAsTaggedInt<false /* allowNegOne */, true /* allowLossyConversion */ >(value);
        if (!taggedInt)
        {
            return false;
        }
        int32 intVal = TaggedInt::ToInt32(taggedInt);
        return this->u.intSet->Test(intVal);
    }

    case SetKind::SimpleVarSet:
    {
        // First check if the value is in the set
        if (this->u.simpleVarSet->ContainsKey(value))
        {
            return true;
        }
        // If the value isn't in the set, check if the canonical value is
        Var simpleVar = JavascriptConversion::TryCanonicalizeAsSimpleVar<true /* allowLossyConversion */>(value);
        // If the simple value is the same as the original value, we know it isn't in the set
        if (!simpleVar || simpleVar == value)
        {
            return false;
        }

        return this->u.simpleVarSet->ContainsKey(simpleVar);
    }

    case SetKind::ComplexVarSet:
        return this->u.complexVarSet->ContainsKey(value);

    default:
        Assume(UNREACHED);
        return false;
    }
}